

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkAddBuffsEval2(Abc_Obj_t *pNode,Abc_Obj_t *pFanin)

{
  Abc_Obj_t *pAVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if ((pFanin->vFanouts).nSize <= lVar2) {
      return 0;
    }
    pAVar1 = (Abc_Obj_t *)pFanin->pNtk->vObjs->pArray[(pFanin->vFanouts).pArray[lVar2]];
    if ((pAVar1 != pNode) &&
       (*(uint *)&pNode->field_0x14 >> 0xc < *(uint *)&pAVar1->field_0x14 >> 0xc)) break;
    lVar2 = lVar2 + 1;
  }
  return 1;
}

Assistant:

int Abc_NtkAddBuffsEval2( Abc_Obj_t * pNode, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pFanin, pFanout, i )
        if ( pFanout != pNode && pFanout->Level > pNode->Level )
            return 1;
    return 0;
}